

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O0

bool __thiscall
google::protobuf::DescriptorPoolDatabase::FindAllExtensionNumbers
          (DescriptorPoolDatabase *this,StringViewArg extendee_type,
          vector<int,_std::allocator<int>_> *output)

{
  DescriptorPool *this_00;
  bool bVar1;
  Descriptor *extendee_00;
  reference ppFVar2;
  string_view name;
  int local_8c;
  FieldDescriptor *local_88;
  FieldDescriptor *extension;
  iterator __end2;
  iterator __begin2;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *__range2;
  undefined1 local_58 [8];
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  extensions;
  Descriptor *extendee;
  vector<int,_std::allocator<int>_> *output_local;
  StringViewArg extendee_type_local;
  DescriptorPoolDatabase *this_local;
  
  this_00 = this->pool_;
  name = (string_view)
         std::__cxx11::string::operator_cast_to_basic_string_view((string *)extendee_type);
  extensions.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)name._M_len;
  extendee_00 = DescriptorPool::FindMessageTypeByName(this_00,name);
  if (extendee_00 == (Descriptor *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    std::
    vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
    ::vector((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              *)local_58);
    DescriptorPool::FindAllExtensions
              (this->pool_,extendee_00,
               (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                *)local_58);
    __end2 = std::
             vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             ::begin((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                      *)local_58);
    extension = (FieldDescriptor *)
                std::
                vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                ::end((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                       *)local_58);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
                                  *)&extension);
      if (!bVar1) break;
      ppFVar2 = __gnu_cxx::
                __normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
                ::operator*(&__end2);
      local_88 = *ppFVar2;
      local_8c = FieldDescriptor::number(local_88);
      std::vector<int,_std::allocator<int>_>::push_back(output,&local_8c);
      __gnu_cxx::
      __normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
      ::operator++(&__end2);
    }
    this_local._7_1_ = true;
    std::
    vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
    ::~vector((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               *)local_58);
  }
  return this_local._7_1_;
}

Assistant:

bool DescriptorPoolDatabase::FindAllExtensionNumbers(
    StringViewArg extendee_type, std::vector<int>* output) {
  const Descriptor* extendee = pool_.FindMessageTypeByName(extendee_type);
  if (extendee == nullptr) return false;

  std::vector<const FieldDescriptor*> extensions;
  pool_.FindAllExtensions(extendee, &extensions);

  for (const FieldDescriptor* extension : extensions) {
    output->push_back(extension->number());
  }

  return true;
}